

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::current_milliseconds_test::~current_milliseconds_test
          (current_milliseconds_test *this)

{
  current_milliseconds_test *this_local;
  
  ~current_milliseconds_test(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {      
      uint64_t millisecondsUTC = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();

      asmcode code;
      uint64_t res = 0;
      try
        {
        code = get_asmcode("(current-milliseconds)");
        }
      catch (std::logic_error e)
        {
        std::cout << e.what();
        }
      first_pass_data d;
      uint64_t size;
      fun_ptr f = (fun_ptr)assemble(size, d, code);
      if (f)
        {
        res = f(&ctxt);
        compiled_functions.emplace_back(f, size);
        res >>= 1;
        }
      TEST_ASSERT(millisecondsUTC <= res);
      millisecondsUTC = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
      TEST_ASSERT(res <= millisecondsUTC);
      }